

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O2

void __thiscall RemoveVCProcessTest::SetUp(RemoveVCProcessTest *this)

{
  RemoveVCProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar1;
  aiMesh *paVar2;
  aiVector3D *paVar3;
  aiAnimation **ppaVar4;
  aiAnimation *paVar5;
  aiTexture **ppaVar6;
  aiTexture *paVar7;
  aiMaterial **ppaVar8;
  aiMaterial *paVar9;
  aiLight **ppaVar10;
  aiLight *paVar11;
  aiCamera **ppaVar12;
  aiCamera *paVar13;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  char check [10];
  
  this_00 = (RemoveVCProcess *)operator_new(0x28);
  Assimp::RemoveVCProcess::RemoveVCProcess(this_00);
  this->piProcess = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->pScene = this_01;
  this_01->mNumMeshes = 2;
  ppaVar1 = (aiMesh **)operator_new__(0x10);
  this_01->mMeshes = ppaVar1;
  paVar2 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar2);
  *this->pScene->mMeshes = paVar2;
  paVar2 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar2);
  this->pScene->mMeshes[1] = paVar2;
  (*this->pScene->mMeshes)->mNumVertices = 0x78;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  (*this->pScene->mMeshes)->mVertices = paVar3;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  (*this->pScene->mMeshes)->mNormals = paVar3;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[0] = paVar3;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[1] = paVar3;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[2] = paVar3;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  (*this->pScene->mMeshes)->mTextureCoords[3] = paVar3;
  this->pScene->mMeshes[1]->mNumVertices = 0x78;
  paVar3 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar3,0,0x5a0);
  this->pScene->mMeshes[1]->mVertices = paVar3;
  this->pScene->mNumAnimations = 2;
  ppaVar4 = (aiAnimation **)operator_new__(0x10);
  this->pScene->mAnimations = ppaVar4;
  paVar5 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar5);
  *this->pScene->mAnimations = paVar5;
  paVar5 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar5);
  this->pScene->mAnimations[1] = paVar5;
  this->pScene->mNumTextures = 2;
  ppaVar6 = (aiTexture **)operator_new__(0x10);
  this->pScene->mTextures = ppaVar6;
  paVar7 = (aiTexture *)operator_new(0x428);
  paVar7->mWidth = 0;
  paVar7->mHeight = 0;
  paVar7->pcData = (aiTexel *)0x0;
  (paVar7->mFilename).length = 0;
  (paVar7->mFilename).data[0] = '\0';
  memset((paVar7->mFilename).data + 1,0x1b,0x3ff);
  paVar7->achFormatHint[0] = '\0';
  paVar7->achFormatHint[1] = '\0';
  paVar7->achFormatHint[2] = '\0';
  paVar7->achFormatHint[3] = '\0';
  *this->pScene->mTextures = paVar7;
  paVar7 = (aiTexture *)operator_new(0x428);
  paVar7->mWidth = 0;
  paVar7->mHeight = 0;
  paVar7->pcData = (aiTexel *)0x0;
  (paVar7->mFilename).length = 0;
  (paVar7->mFilename).data[0] = '\0';
  memset((paVar7->mFilename).data + 1,0x1b,0x3ff);
  paVar7->achFormatHint[0] = '\0';
  paVar7->achFormatHint[1] = '\0';
  paVar7->achFormatHint[2] = '\0';
  paVar7->achFormatHint[3] = '\0';
  this->pScene->mTextures[1] = paVar7;
  this->pScene->mNumMaterials = 2;
  ppaVar8 = (aiMaterial **)operator_new__(0x10);
  this->pScene->mMaterials = ppaVar8;
  paVar9 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar9);
  *this->pScene->mMaterials = paVar9;
  paVar9 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar9);
  this->pScene->mMaterials[1] = paVar9;
  this->pScene->mNumLights = 2;
  ppaVar10 = (aiLight **)operator_new__(0x10);
  this->pScene->mLights = ppaVar10;
  paVar11 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(paVar11);
  *this->pScene->mLights = paVar11;
  paVar11 = (aiLight *)operator_new(0x46c);
  aiLight::aiLight(paVar11);
  this->pScene->mLights[1] = paVar11;
  this->pScene->mNumCameras = 2;
  ppaVar12 = (aiCamera **)operator_new__(0x10);
  this->pScene->mCameras = ppaVar12;
  paVar13 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(paVar13);
  *this->pScene->mCameras = paVar13;
  paVar13 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(paVar13);
  this->pScene->mCameras[1] = paVar13;
  check[0] = '\0';
  local_60.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,char>
            ((internal *)&gtest_ar,"0","check[0]",(int *)&local_60,check);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void RemoveVCProcessTest::SetUp()
{
    // construct the process
    piProcess = new RemoveVCProcess();
    pScene = new aiScene();

    // fill the scene ..
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 2];
    pScene->mMeshes[0] = new aiMesh();
    pScene->mMeshes[1] = new aiMesh();

    pScene->mMeshes[0]->mNumVertices = 120;
    pScene->mMeshes[0]->mVertices = new aiVector3D[120];
    pScene->mMeshes[0]->mNormals = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[0] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[1] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[2] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[3] = new aiVector3D[120];

    pScene->mMeshes[1]->mNumVertices = 120;
    pScene->mMeshes[1]->mVertices = new aiVector3D[120];

    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations = 2];
    pScene->mAnimations[0] = new aiAnimation();
    pScene->mAnimations[1] = new aiAnimation();

    pScene->mTextures = new aiTexture*[pScene->mNumTextures = 2];
    pScene->mTextures[0] = new aiTexture();
    pScene->mTextures[1] = new aiTexture();

    pScene->mMaterials    = new aiMaterial*[pScene->mNumMaterials = 2];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mMaterials[1] = new aiMaterial();

    pScene->mLights    = new aiLight*[pScene->mNumLights = 2];
    pScene->mLights[0] = new aiLight();
    pScene->mLights[1] = new aiLight();

    pScene->mCameras    = new aiCamera*[pScene->mNumCameras = 2];
    pScene->mCameras[0] = new aiCamera();
    pScene->mCameras[1] = new aiCamera();

    // COMPILE TEST: aiMaterial may no add any extra members,
    // so we don't need a virtual destructor
    char check[sizeof(aiMaterial) == sizeof(aiMaterial) ? 10 : -1];
    check[0] = 0;
    // to remove compiler warning
    EXPECT_EQ( 0, check[0] );
}